

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::writeInfo(BMP *this,ofstream *out)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  if (out == (ofstream *)0x0) {
    out = (ofstream *)&std::cout;
  }
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"General Information of BMP Files\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bfType: ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bfSize: ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bfReserved1: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bfReserved2: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bfOffBits: ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,"\nHeader Information of BMP Files\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biSize: ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biWidth: ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(this->headInfo).biWidth);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biHeight: ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(this->headInfo).biHeight);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biPlanes: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biBitCount: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biCompression: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biSizeImage: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biXPelsPerMeter: ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(this->headInfo).biXPelsPerMeter);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biYPelsPerMeter: ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(this->headInfo).biYPelsPerMeter);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biClrUsed: ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"biClrImportant: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void BMP::writeInfo( std::ofstream *out ) {
    using namespace std;

    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    if ( flag ) {
        ( *out ) << "General Information of BMP Files\n";
        ( *out ) << "bfType: " << head.bfType << '\n';
        ( *out ) << "bfSize: " << head.bfSize << '\n';
        ( *out ) << "bfReserved1: " << head.bfReserved1 << '\n';
        ( *out ) << "bfReserved2: " << head.bfReserved2 << '\n';
        ( *out ) << "bfOffBits: " << head.bfOffBits << '\n';

        ( *out ) << "\nHeader Information of BMP Files\n";
        ( *out ) << "biSize: " << headInfo.biSize << '\n';
        ( *out ) << "biWidth: " << headInfo.biWidth << '\n';
        ( *out ) << "biHeight: " << headInfo.biHeight << '\n';
        ( *out ) << "biPlanes: " << headInfo.biPlanes << '\n';
        ( *out ) << "biBitCount: " << headInfo.biBitCount << '\n';
        ( *out ) << "biCompression: " << headInfo.biCompression << '\n';
        ( *out ) << "biSizeImage: " << headInfo.biSizeImage << '\n';
        ( *out ) << "biXPelsPerMeter: " << headInfo.biXPelsPerMeter << '\n';
        ( *out ) << "biYPelsPerMeter: " << headInfo.biYPelsPerMeter << '\n';
        ( *out ) << "biClrUsed: " << headInfo.biClrUsed << '\n';
        ( *out ) << "biClrImportant: " << headInfo.biClrImportant << '\n';

    } else {
        cout << "General Information of BMP Files\n";
        cout << "bfType: " << head.bfType << '\n';
        cout << "bfSize: " << head.bfSize << '\n';
        cout << "bfReserved1: " << head.bfReserved1 << '\n';
        cout << "bfReserved2: " << head.bfReserved2 << '\n';
        cout << "bfOffBits: " << head.bfOffBits << '\n';

        cout << "\nHeader Information of BMP Files\n";
        cout << "biSize: " << headInfo.biSize << '\n';
        cout << "biWidth: " << headInfo.biWidth << '\n';
        cout << "biHeight: " << headInfo.biHeight << '\n';
        cout << "biPlanes: " << headInfo.biPlanes << '\n';
        cout << "biBitCount: " << headInfo.biBitCount << '\n';
        cout << "biCompression: " << headInfo.biCompression << '\n';
        cout << "biSizeImage: " << headInfo.biSizeImage << '\n';
        cout << "biXPelsPerMeter: " << headInfo.biXPelsPerMeter << '\n';
        cout << "biYPelsPerMeter: " << headInfo.biYPelsPerMeter << '\n';
        cout << "biClrUsed: " << headInfo.biClrUsed << '\n';
        cout << "biClrImportant: " << headInfo.biClrImportant << '\n';
    }
}